

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImage.cpp
# Opt level: O1

void __thiscall Imf_3_2::Image::renameChannel(Image *this,string *oldName,string *newName)

{
  ChannelMap *this_00;
  _Rb_tree_header *p_Var1;
  size_t __n;
  long *plVar2;
  _Rb_tree_color _Var3;
  undefined4 uVar4;
  int iVar5;
  iterator __position;
  iterator iVar6;
  long lVar7;
  mapped_type *pmVar8;
  ostream *poVar9;
  ArgExc *pAVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  stringstream _iex_throw_s;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  __n = oldName->_M_string_length;
  if (__n == newName->_M_string_length) {
    if (__n == 0) {
      return;
    }
    iVar5 = bcmp((oldName->_M_dataplus)._M_p,(newName->_M_dataplus)._M_p,__n);
    if (iVar5 == 0) {
      return;
    }
  }
  this_00 = &this->_channels;
  __position = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>_>
               ::find(&this_00->_M_t,oldName);
  p_Var1 = &(this->_channels)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)__position._M_node == p_Var1) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"Cannot rename image channel ",0x1c);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(oldName->_M_dataplus)._M_p,oldName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," to ",4);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,(newName->_M_dataplus)._M_p,newName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,".  The image does not have a channel called ",0x2c);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,(oldName->_M_dataplus)._M_p,oldName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,".",1);
    pAVar10 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(pAVar10,local_1b8);
    __cxa_throw(pAVar10,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>_>
          ::find(&this_00->_M_t,newName);
  if ((_Rb_tree_header *)iVar6._M_node == p_Var1) {
    if (0 < (this->_levels)._sizeX) {
      lVar11 = 0;
      lVar12 = 0;
      do {
        lVar7 = (this->_levels)._sizeY;
        if (0 < lVar7) {
          lVar13 = 0;
          do {
            plVar2 = *(long **)((long)(this->_levels)._data + lVar13 * 8 + lVar7 * lVar11);
            if (plVar2 != (long *)0x0) {
              (**(code **)(*plVar2 + 0x38))(plVar2,oldName,newName);
            }
            lVar13 = lVar13 + 1;
            lVar7 = (this->_levels)._sizeY;
          } while (lVar13 < lVar7);
        }
        lVar12 = lVar12 + 1;
        lVar11 = lVar11 + 8;
      } while (lVar12 < (this->_levels)._sizeX);
    }
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>_>
             ::operator[](this_00,newName);
    _Var3 = __position._M_node[2]._M_color;
    uVar4 = *(undefined4 *)&__position._M_node[2].field_0x4;
    *(undefined8 *)((long)&pmVar8->xSampling + 1) = *(undefined8 *)&__position._M_node[2].field_0x5;
    pmVar8->type = _Var3;
    pmVar8->xSampling = uVar4;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Imf_3_2::Image::ChannelInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,Imf_3_2::Image::ChannelInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Imf_3_2::Image::ChannelInfo>>>
    ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Imf_3_2::Image::ChannelInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,Imf_3_2::Image::ChannelInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Imf_3_2::Image::ChannelInfo>>>
                        *)this_00,__position);
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Cannot rename image channel ",0x1c);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(oldName->_M_dataplus)._M_p,oldName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," to ",4);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,(newName->_M_dataplus)._M_p,newName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,".  The image already has a channel called ",0x2a);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,(newName->_M_dataplus)._M_p,newName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,".",1);
  pAVar10 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::ArgExc::ArgExc(pAVar10,local_1b8);
  __cxa_throw(pAVar10,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
}

Assistant:

void
Image::renameChannel (const string& oldName, const string& newName)
{
    if (oldName == newName) return;

    ChannelMap::iterator oldChannel = _channels.find (oldName);

    if (oldChannel == _channels.end ())
    {
        THROW (
            ArgExc,
            "Cannot rename image channel " << oldName
                                           << " "
                                              "to "
                                           << newName
                                           << ".  The image does not have "
                                              "a channel called "
                                           << oldName << ".");
    }

    if (_channels.find (newName) != _channels.end ())
    {
        THROW (
            ArgExc,
            "Cannot rename image channel " << oldName
                                           << " "
                                              "to "
                                           << newName
                                           << ".  The image already has "
                                              "a channel called "
                                           << newName << ".");
    }

    try
    {
        for (int y = 0; y < _levels.height (); ++y)
            for (int x = 0; x < _levels.width (); ++x)
                if (_levels[y][x])
                    _levels[y][x]->renameChannel (oldName, newName);

        _channels[newName] = oldChannel->second;
        _channels.erase (oldChannel);
    }
    catch (...)
    {
        eraseChannel (oldName);
        eraseChannel (newName);
        throw;
    }
}